

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O0

void __thiscall cppgenerate::Constructor::Constructor(Constructor *this,Constructor *other)

{
  Constructor *other_local;
  Constructor *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::list<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>::list
            (&this->m_arguments);
  CodeBlock::CodeBlock(&this->m_code);
  std::__cxx11::string::operator=((string *)this,(string *)other);
  std::__cxx11::list<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>::operator=
            (&this->m_arguments,&other->m_arguments);
  CodeBlock::operator=(&this->m_code,&other->m_code);
  this->m_accessModifier = other->m_accessModifier;
  return;
}

Assistant:

Constructor::Constructor( const Constructor& other ){
    m_documentation = other.m_documentation;
    m_arguments = other.m_arguments;
    m_code = other.m_code;
    m_accessModifier = other.m_accessModifier;
}